

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O1

void __thiscall
phosg::Image::mask_blit
          (Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,ssize_t sy,
          Image *mask)

{
  long x_00;
  ulong uVar1;
  runtime_error *this_00;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  uint64_t b;
  uint64_t g;
  uint64_t r;
  uint64_t a;
  long local_90;
  uint64_t local_88;
  uint64_t local_80;
  uint64_t local_78;
  ulong local_70;
  Image *local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  uint64_t local_38;
  
  if (w < 0) {
    w = source->width;
  }
  if (h < 0) {
    h = source->height;
  }
  local_68 = this;
  if (((ulong)w <= (ulong)mask->width) && ((ulong)h <= (ulong)mask->height)) {
    uVar1 = sx >> 0x3f & sx;
    local_40 = x - uVar1;
    lVar4 = 0;
    if (sx < 1) {
      sx = lVar4;
    }
    uVar2 = sy >> 0x3f & sy;
    local_58 = y - uVar2;
    if (sy < 1) {
      sy = lVar4;
    }
    local_50 = 0;
    if (0 < local_40) {
      local_50 = local_40;
    }
    if (-1 < local_40) {
      local_40 = lVar4;
    }
    uVar1 = uVar1 + w + local_40;
    local_40 = sx - local_40;
    local_60 = 0;
    if (0 < local_58) {
      local_60 = local_58;
    }
    if (-1 < local_58) {
      local_58 = lVar4;
    }
    uVar3 = uVar2 + h + local_58;
    local_58 = sy - local_58;
    uVar2 = source->width - local_40;
    if ((long)(uVar1 + local_40) <= source->width) {
      uVar2 = uVar1;
    }
    uVar1 = source->height - local_58;
    if ((long)(uVar3 + local_58) <= source->height) {
      uVar1 = uVar3;
    }
    uVar3 = this->width - local_50;
    if ((long)(uVar2 + local_50) <= this->width) {
      uVar3 = uVar2;
    }
    local_70 = this->height - local_60;
    if ((long)(uVar1 + local_60) <= this->height) {
      local_70 = uVar1;
    }
    bVar6 = -1 < (long)(uVar3 | local_70);
    if ((bVar6) && (bVar7 = -1 < (long)local_70, 0 < (long)local_70)) {
      local_90 = 0;
      do {
        if (0 < (long)uVar3 && bVar7) {
          lVar4 = local_90 + local_58;
          local_48 = local_60 + local_90;
          lVar5 = 0;
          do {
            x_00 = local_40 + lVar5;
            read_pixel(mask,x_00,lVar4,&local_78,&local_80,&local_88,(uint64_t *)0x0);
            if (((local_78 != 0xff) || (local_80 != 0xff)) || (local_88 != 0xff)) {
              read_pixel(source,x_00,lVar4,&local_78,&local_80,&local_88,&local_38);
              write_pixel(local_68,local_50 + lVar5,local_48,local_78,local_80,local_88,local_38);
            }
            lVar5 = lVar5 + 1;
          } while (bVar6 && lVar5 < (long)uVar3);
        }
        local_90 = local_90 + 1;
      } while (bVar6 && local_90 < (long)local_70);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this_00,"mask is too small to cover copied area");
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Image::mask_blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy, const Image& mask) {
  if (w < 0) {
    w = source.get_width();
  }
  if (h < 0) {
    h = source.get_height();
  }

  // The mask image must cover the entire area to be blitted, but it does NOT
  // have to cover the entire destination or source image. The mask is indexed
  // in source-space, though, so its upper-left corner must be aligned with the
  // source image's upper-left corner.
  if ((mask.get_width() < static_cast<size_t>(w)) ||
      (mask.get_height() < static_cast<size_t>(h))) {
    throw runtime_error("mask is too small to cover copied area");
  }

  clamp_blit_dimensions(*this, source, &x, &y, &w, &h, &sx, &sy);

  for (ssize_t yy = 0; yy < h; yy++) {
    for (ssize_t xx = 0; xx < w; xx++) {
      uint64_t r, g, b, a;
      mask.read_pixel(sx + xx, sy + yy, &r, &g, &b);
      if (r == 0xFF && g == 0xFF && b == 0xFF) {
        continue;
      }
      source.read_pixel(sx + xx, sy + yy, &r, &g, &b, &a);
      this->write_pixel(x + xx, y + yy, r, g, b, a);
    }
  }
}